

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

size_t SaveMultiChannelEXRToMemory(EXRImage *exrImage,uchar **memory_out,char **err)

{
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  char cVar5;
  uint uVar6;
  undefined8 uVar7;
  int *piVar8;
  pointer puVar9;
  pointer paVar10;
  undefined4 uVar11;
  pointer pDest;
  size_t sVar12;
  _Alloc_hider _Var13;
  char *pcVar14;
  undefined8 *puVar15;
  int iVar16;
  uint uVar17;
  char cVar18;
  long lVar19;
  size_type sVar20;
  uchar *puVar21;
  pointer puVar22;
  uchar **data_00;
  long lVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  unsigned_long uVar27;
  int iVar28;
  uint uVar29;
  float fVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  ushort uVar34;
  pointer paVar35;
  value_type_conflict5 *__val;
  long lVar36;
  pointer paVar37;
  int iVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar41 [16];
  undefined1 in_ZMM1 [64];
  undefined1 extraout_var [56];
  vector<unsigned_char,_std::allocator<unsigned_char>_> memory;
  char header [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  dataList;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channelOffsetList;
  vector<long_long,_std::allocator<long_long>_> offsets;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  int local_1b8;
  int local_1b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1a8;
  value_type local_188;
  int local_14c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_128;
  long local_110;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  local_108;
  pointer local_e8;
  pointer local_e0;
  pointer local_d8;
  ulong local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  size_type local_b0;
  uchar *local_a8;
  vector<long_long,_std::allocator<long_long>_> local_a0;
  long local_80;
  uchar **local_78;
  size_type local_70;
  long local_68;
  size_type local_60;
  int *local_58;
  pointer local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  if (exrImage == (EXRImage *)0x0 || memory_out == (uchar **)0x0) {
    if (err != (char **)0x0) {
      *err = "Invalid argument.";
    }
    return 0xffffffffffffffff;
  }
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
  local_188.name._M_dataplus._M_p._0_4_ = 3.2543817e-38;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1a8,0,&local_188);
  local_188.name._M_dataplus._M_p._0_4_ = 2.8026e-45;
  local_78 = memory_out;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1a8,
             local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_188);
  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_108.
  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.
  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (0 < exrImage->num_channels) {
    paVar2 = &local_188.name.field_2;
    lVar36 = 0;
    do {
      local_188.name._M_string_length = 0;
      local_188.name.field_2._M_local_buf[0] = '\0';
      local_188.pLinear = '\0';
      local_188.pixelType = exrImage->requested_pixel_types[lVar36];
      local_188.xSampling = 1;
      local_188.ySampling = 1;
      local_188.name._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::string
                ((string *)&local_a0,exrImage->channel_names[lVar36],(allocator *)&local_c8);
      std::__cxx11::string::operator=((string *)&local_188,(string *)&local_a0);
      in_ZMM1._8_56_ = extraout_var;
      in_ZMM1._0_8_ = extraout_XMM1_Qa;
      if ((pointer *)
          local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ::push_back(&local_108,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188.name._M_dataplus._M_p != paVar2) {
        operator_delete(local_188.name._M_dataplus._M_p);
      }
      lVar36 = lVar36 + 1;
    } while (lVar36 < exrImage->num_channels);
  }
  paVar10 = local_108.
            super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  paVar37 = local_108.
            super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_108.
            super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_108.
            super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ._M_impl.super__Vector_impl_data._M_start == 0) {
    sVar20 = 1;
  }
  else {
    lVar23 = ((long)local_108.
                    super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_108.
                    super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
    lVar23 = lVar23 + (ulong)(lVar23 == 0);
    lVar36 = 0;
    paVar35 = local_108.
              super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      sVar12 = strlen((paVar35->name)._M_dataplus._M_p);
      lVar19 = lVar36 + sVar12;
      lVar36 = lVar19 + 0x11;
      paVar35 = paVar35 + 1;
      lVar23 = lVar23 + -1;
    } while (lVar23 != 0);
    sVar20 = lVar19 + 0x12;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_148,sVar20);
  auVar41 = in_ZMM1._0_16_;
  if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar36 = 0;
LAB_00143ee2:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,lVar36)
    ;
  }
  else {
    puVar22 = local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((long)paVar10 - (long)paVar37 != 0) {
      lVar36 = ((long)paVar10 - (long)paVar37 >> 4) * -0x5555555555555555;
      lVar36 = lVar36 + (ulong)(lVar36 == 0);
      do {
        pcVar14 = (paVar37->name)._M_dataplus._M_p;
        sVar12 = strlen(pcVar14);
        memcpy(puVar22,pcVar14,sVar12);
        sVar12 = strlen((paVar37->name)._M_dataplus._M_p);
        auVar41 = in_ZMM1._0_16_;
        puVar21 = puVar22 + sVar12;
        puVar22 = puVar21 + 0x11;
        *puVar21 = '\0';
        uVar7 = *(undefined8 *)&paVar37->xSampling;
        *(int *)(puVar21 + 1) = paVar37->pixelType;
        puVar21[5] = paVar37->pLinear;
        *(undefined8 *)(puVar21 + 9) = uVar7;
        paVar37 = paVar37 + 1;
        lVar36 = lVar36 + -1;
      } while (lVar36 != 0);
    }
    *puVar22 = '\0';
    lVar36 = (long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if (lVar36 == 0) goto LAB_00143ee2;
    anon_unknown.dwarf_1096b8::WriteAttributeToMemory
              (&local_1a8,"channels","chlist",
               local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,(int)lVar36);
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::~vector(&local_108);
    if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    local_188.name._M_dataplus._M_p._0_4_ = 4.2039e-45;
    anon_unknown.dwarf_1096b8::WriteAttributeToMemory
              (&local_1a8,"compression","compression",(uchar *)&local_188,1);
    local_188.name._M_dataplus._M_p = (pointer)0x0;
    uVar3 = exrImage->width;
    uVar4 = exrImage->height;
    auVar40._4_4_ = uVar4;
    auVar40._0_4_ = uVar3;
    auVar41 = vpcmpeqd_avx(auVar41,auVar41);
    auVar40._8_8_ = 0;
    auVar41 = vpaddd_avx(auVar40,auVar41);
    local_188.name._M_string_length = auVar41._0_8_;
    anon_unknown.dwarf_1096b8::WriteAttributeToMemory
              (&local_1a8,"dataWindow","box2i",(uchar *)&local_188,0x10);
    anon_unknown.dwarf_1096b8::WriteAttributeToMemory
              (&local_1a8,"displayWindow","box2i",(uchar *)&local_188,0x10);
    local_188.name._M_dataplus._M_p = local_188.name._M_dataplus._M_p & 0xffffffffffffff00;
    anon_unknown.dwarf_1096b8::WriteAttributeToMemory
              (&local_1a8,"lineOrder","lineOrder",(uchar *)&local_188,1);
    local_188.name._M_dataplus._M_p._0_4_ = 1.0;
    anon_unknown.dwarf_1096b8::WriteAttributeToMemory
              (&local_1a8,"pixelAspectRatio","float",(uchar *)&local_188,4);
    local_188.name._M_dataplus._M_p = (pointer)0x0;
    anon_unknown.dwarf_1096b8::WriteAttributeToMemory
              (&local_1a8,"screenWindowCenter","v2f",(uchar *)&local_188,8);
    local_188.name._M_dataplus._M_p._0_4_ = (float)exrImage->width;
    anon_unknown.dwarf_1096b8::WriteAttributeToMemory
              (&local_1a8,"screenWindowWidth","float",(uchar *)&local_188,4);
    if ((0 < exrImage->num_custom_attributes) &&
       (puts("custom"), 0 < exrImage->num_custom_attributes)) {
      data_00 = &exrImage->custom_attributes[0].value;
      lVar36 = 0;
      do {
        anon_unknown.dwarf_1096b8::WriteAttributeToMemory
                  (&local_1a8,((EXRAttribute *)(data_00 + -3))->name,(char *)data_00[-2],
                   (uchar *)data_00,*(int *)(data_00 + -1));
        lVar36 = lVar36 + 1;
        data_00 = data_00 + 4;
      } while (lVar36 < exrImage->num_custom_attributes);
    }
    local_188.name._M_dataplus._M_p = local_188.name._M_dataplus._M_p & 0xffffffffffffff00;
    if (local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1a8,
                 (iterator)
                 local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish,(uchar *)&local_188);
    }
    else {
      *local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish = '\0';
      local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    uVar6 = exrImage->height;
    uVar32 = uVar6 + 0xf;
    if (-1 < (int)uVar6) {
      uVar32 = uVar6;
    }
    local_14c = (uint)((int)(uVar32 & 0xfffffff0) < (int)uVar6) + ((int)uVar32 >> 4);
    sVar20 = (size_type)local_14c;
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (&local_a0,sVar20,(allocator_type *)&local_188);
    lVar36 = sVar20 * 8;
    local_a8 = local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish +
               (lVar36 - (long)local_1a8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
    local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uchar *)0x0;
    local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (uchar *)0x0;
    local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b0 = sVar20;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)&local_108,sVar20,(allocator_type *)&local_188);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_c8,(long)exrImage->num_channels,(allocator_type *)&local_188);
    iVar26 = exrImage->num_channels;
    local_80 = lVar36;
    if ((long)iVar26 < 1) {
      local_1b8 = 0;
    }
    else {
      piVar8 = exrImage->requested_pixel_types;
      lVar36 = 0;
      local_1b8 = 0;
      uVar27 = 0;
      do {
        local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar36] = uVar27;
        uVar39 = (ulong)(uint)piVar8[lVar36];
        if (2 < uVar39) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                        ,0x26f0,
                        "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
                       );
        }
        local_1b8 = local_1b8 + *(int *)(&DAT_001e3628 + uVar39 * 4);
        uVar27 = uVar27 + *(long *)(&DAT_001e3610 + uVar39 * 8);
        lVar36 = lVar36 + 1;
      } while (iVar26 != lVar36);
    }
    if (0 < local_14c) {
      local_1b0 = 0;
      local_70 = 0;
      do {
        local_68 = local_70 << 4;
        iVar26 = exrImage->height;
        iVar25 = (int)(local_70 + 1);
        iVar16 = iVar25 * 0x10;
        if (SBORROW4(iVar26,iVar16) != iVar26 + iVar25 * -0x10 < 0) {
          iVar16 = iVar26;
        }
        iVar16 = iVar16 - (int)local_68;
        local_60 = local_70;
        local_70 = local_70 + 1;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_128,(long)(iVar16 * local_1b8 * exrImage->width),
                   (allocator_type *)&local_188);
        if (0 < exrImage->num_channels) {
          local_58 = exrImage->pixel_types;
          local_110 = (long)iVar16;
          lVar36 = 0;
          do {
            iVar26 = local_58[lVar36];
            if (iVar26 == 2) {
              if (exrImage->requested_pixel_types[lVar36] == 1) {
                if (0 < iVar16) {
                  uVar6 = exrImage->width;
                  local_e0 = local_c8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  local_e8 = (pointer)(long)(int)uVar6;
                  local_50 = local_128.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  uVar32 = local_1b0 * uVar6;
                  iVar26 = 0;
                  lVar23 = 0;
                  do {
                    if (0 < (int)uVar6) {
                      uVar27 = local_c8.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar36];
                      puVar21 = exrImage->images[lVar36];
                      uVar39 = 0;
                      local_d8 = (pointer)CONCAT44(local_d8._4_4_,uVar32);
                      do {
                        uVar29 = *(uint *)(puVar21 + uVar39 * 4 + (ulong)uVar32 * 4);
                        uVar17 = uVar29 >> 0x17;
                        uVar31 = uVar17 & 0xff;
                        uVar34 = (ushort)uVar31;
                        if ((char)uVar17 != '\0') {
                          if (uVar31 == 0xff) {
                            uVar34 = ((uVar29 & 0x7fffff) != 0 | 0x3e) << 9;
                          }
                          else {
                            uVar34 = 0x7c00;
                            if (uVar31 < 0x8f) {
                              if (uVar31 < 0x71) {
                                uVar34 = 0;
                                if (uVar31 < 0x66) goto LAB_001439aa;
                                uVar33 = uVar29 & 0x7fffff | 0x800000;
                                uVar34 = (ushort)(uVar33 >> (0x7eU - (char)uVar17 & 0x1f)) & 0x3ff;
                                uVar33 = uVar33 >> (0x7d - uVar31 & 0x1f);
                              }
                              else {
                                uVar34 = ((ushort)(uVar29 >> 0xd) & 0x3ff |
                                         (ushort)((uVar17 & 0x1f) << 10)) ^ 0x4000;
                                uVar33 = uVar29 >> 0xc;
                              }
                              uVar34 = uVar34 + ((uVar33 & 1) != 0);
                            }
LAB_001439aa:
                            uVar34 = uVar34 & 0x7fff;
                          }
                        }
                        if ((ulong)((long)local_128.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_128.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start) <=
                            (long)(int)(uVar6 * local_1b8 * (int)lVar23) + uVar27 * (long)local_e8)
                        goto LAB_00143ddf;
                        *(ushort *)
                         (local_128.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                         uVar39 * 2 + uVar27 * (long)local_e8 + (long)iVar26) =
                             uVar34 | (ushort)(uVar29 >> 0x10) & 0x8000;
                        uVar39 = uVar39 + 1;
                      } while (uVar6 != uVar39);
                    }
                    lVar23 = lVar23 + 1;
                    uVar32 = uVar32 + uVar6;
                    iVar26 = iVar26 + uVar6 * local_1b8;
                  } while (lVar23 < local_110);
                }
              }
              else {
                if (exrImage->requested_pixel_types[lVar36] != 2) goto LAB_00143e17;
                if (0 < iVar16) {
                  uVar6 = exrImage->width;
                  uVar32 = local_1b0 * uVar6;
                  iVar26 = 0;
                  lVar23 = 0;
                  do {
                    if (0 < (int)uVar6) {
                      uVar27 = local_c8.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar36];
                      if ((ulong)((long)local_128.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_128.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start) <=
                          (long)(int)(uVar6 * local_1b8 * (int)lVar23) + uVar27 * (long)(int)uVar6)
                      goto LAB_00143dfb;
                      puVar21 = exrImage->images[lVar36];
                      uVar39 = 0;
                      do {
                        *(undefined4 *)
                         (local_128.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                         uVar39 * 4 + uVar27 * (long)(int)uVar6 + (long)iVar26) =
                             *(undefined4 *)(puVar21 + uVar39 * 4 + (ulong)uVar32 * 4);
                        uVar39 = uVar39 + 1;
                      } while (uVar6 != uVar39);
                    }
                    lVar23 = lVar23 + 1;
                    uVar32 = uVar32 + uVar6;
                    iVar26 = iVar26 + uVar6 * local_1b8;
                  } while (lVar23 < local_110);
                }
              }
            }
            else if (iVar26 == 1) {
              if (exrImage->requested_pixel_types[lVar36] == 2) {
                if (0 < iVar16) {
                  uVar6 = exrImage->width;
                  local_d8 = local_c8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  local_e0 = (pointer)(long)(int)uVar6;
                  local_e8 = local_128.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  uVar32 = local_1b0 * uVar6;
                  iVar26 = 0;
                  lVar23 = 0;
                  do {
                    if (0 < (int)uVar6) {
                      uVar27 = local_c8.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar36];
                      puVar21 = exrImage->images[lVar36];
                      uVar39 = 0;
                      do {
                        uVar29 = (uint)*(ushort *)(puVar21 + uVar39 * 2 + (ulong)uVar32 * 2) << 0xd;
                        if ((uVar29 & 0xf800000) == 0xf800000) {
                          fVar30 = (float)(uVar29 | 0x70000000);
                        }
                        else if ((uVar29 & 0xf800000) == 0) {
                          fVar30 = (float)(uVar29 | 0x38800000) + -6.1035156e-05;
                        }
                        else {
                          fVar30 = (float)((uVar29 & 0xfffe000) + 0x38000000);
                        }
                        if ((ulong)((long)local_128.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_128.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start) <=
                            (long)(int)(uVar6 * local_1b8 * (int)lVar23) + uVar27 * (long)local_e0)
                        goto LAB_00143ded;
                        *(uint *)(local_128.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start +
                                 uVar39 * 4 + uVar27 * (long)local_e0 + (long)iVar26) =
                             (uint)fVar30 |
                             (int)(short)*(ushort *)(puVar21 + uVar39 * 2 + (ulong)uVar32 * 2) &
                             0x80000000U;
                        uVar39 = uVar39 + 1;
                      } while (uVar6 != uVar39);
                    }
                    lVar23 = lVar23 + 1;
                    uVar32 = uVar32 + uVar6;
                    iVar26 = iVar26 + uVar6 * local_1b8;
                  } while (lVar23 < local_110);
                }
              }
              else {
                if (exrImage->requested_pixel_types[lVar36] != 1) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                                ,0x2728,
                                "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
                               );
                }
                if (0 < iVar16) {
                  uVar6 = exrImage->width;
                  uVar32 = local_1b0 * uVar6;
                  iVar26 = 0;
                  lVar23 = 0;
                  do {
                    if (0 < (int)uVar6) {
                      uVar27 = local_c8.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar36];
                      if ((ulong)((long)local_128.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_128.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start) <=
                          (long)(int)(uVar6 * local_1b8 * (int)lVar23) + uVar27 * (long)(int)uVar6)
                      goto LAB_00143e09;
                      puVar21 = exrImage->images[lVar36];
                      uVar39 = 0;
                      do {
                        *(undefined2 *)
                         (local_128.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                         uVar39 * 2 + uVar27 * (long)(int)uVar6 + (long)iVar26) =
                             *(undefined2 *)(puVar21 + uVar39 * 2 + (ulong)uVar32 * 2);
                        uVar39 = uVar39 + 1;
                      } while (uVar6 != uVar39);
                    }
                    lVar23 = lVar23 + 1;
                    uVar32 = uVar32 + uVar6;
                    iVar26 = iVar26 + uVar6 * local_1b8;
                  } while (lVar23 < local_110);
                }
              }
            }
            else if ((iVar26 == 0) && (0 < iVar16)) {
              iVar25 = 0;
              iVar28 = 0;
              iVar26 = local_1b0;
              do {
                uVar39 = (ulong)(uint)exrImage->width;
                if (0 < exrImage->width) {
                  uVar27 = local_c8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[lVar36];
                  lVar23 = 0;
                  do {
                    iVar38 = (int)uVar39;
                    if ((ulong)((long)local_128.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_128.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start) <=
                        (long)(iVar28 * local_1b8 * iVar38) + (long)iVar38 * uVar27) {
                      std::__throw_out_of_range_fmt
                                (
                                "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                );
LAB_00143ddf:
                      std::__throw_out_of_range_fmt
                                (
                                "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                );
LAB_00143ded:
                      std::__throw_out_of_range_fmt
                                (
                                "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                );
                      goto LAB_00143dfb;
                    }
                    *(undefined4 *)
                     (local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                     lVar23 * 4 + (long)iVar38 * uVar27 + (long)(iVar38 * iVar25)) =
                         *(undefined4 *)
                          (exrImage->images[lVar36] + (long)(iVar26 * iVar38 + (int)lVar23) * 4);
                    lVar23 = lVar23 + 1;
                    uVar39 = (ulong)exrImage->width;
                  } while (lVar23 < (long)uVar39);
                }
                iVar28 = iVar28 + 1;
                iVar26 = iVar26 + 1;
                iVar25 = iVar25 + local_1b8;
              } while (iVar28 < iVar16);
            }
            lVar36 = lVar36 + 1;
          } while (lVar36 < exrImage->num_channels);
        }
        uVar24 = (long)local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        uVar39 = (uVar24 * 0x6e) / 100 + 0x80;
        uVar24 = uVar24 + (uVar24 / 0x7c00) * 5 + 0x85;
        if (uVar24 < uVar39) {
          uVar24 = uVar39;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_48,uVar24,(allocator_type *)&local_188);
        pDest = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
        puVar9 = local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        puVar22 = local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          sVar20 = 0;
LAB_00143e77:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                     sVar20);
LAB_00143e8a:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
LAB_00143e9c:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
LAB_00143eae:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
LAB_00143ec0:
          __assert_fail("ret == miniz::MZ_OK",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                        ,0x1bc6,
                        "void (anonymous namespace)::CompressZip(unsigned char *, unsigned long long &, const unsigned char *, unsigned long)"
                       );
        }
        sVar20 = (long)local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        if (sVar20 == 0) goto LAB_00143e77;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188,sVar20,
                   (allocator_type *)&local_d0);
        if ((pointer)local_188.name._M_string_length == local_188.name._M_dataplus._M_p)
        goto LAB_00143e8a;
        if (0 < (long)sVar20) {
          _Var13._M_p = local_188.name._M_dataplus._M_p;
          do {
            *_Var13._M_p = *puVar22;
            if (puVar9 <= puVar22 + 1) break;
            _Var13._M_p[sVar20 + 1 >> 1] = puVar22[1];
            _Var13._M_p = _Var13._M_p + 1;
            puVar22 = puVar22 + 2;
          } while (puVar22 < puVar9);
        }
        if ((pointer)local_188.name._M_string_length == local_188.name._M_dataplus._M_p)
        goto LAB_00143e9c;
        if (1 < (long)sVar20) {
          pcVar14 = local_188.name._M_dataplus._M_p + 1;
          cVar18 = *local_188.name._M_dataplus._M_p;
          do {
            cVar5 = *pcVar14;
            *pcVar14 = (cVar5 - cVar18) + -0x80;
            pcVar14 = pcVar14 + 1;
            cVar18 = cVar5;
          } while (pcVar14 < local_188.name._M_dataplus._M_p + sVar20);
        }
        local_d0 = (sVar20 * 0x6e) / 100 + 0x80;
        uVar39 = (sVar20 / 0x7c00) * 5 + sVar20 + 0x85;
        if (local_d0 <= uVar39) {
          local_d0 = uVar39;
        }
        if ((pointer)local_188.name._M_string_length == local_188.name._M_dataplus._M_p)
        goto LAB_00143eae;
        iVar26 = mz_compress2(pDest,&local_d0,(uchar *)local_188.name._M_dataplus._M_p,sVar20,-1);
        if (iVar26 != 0) goto LAB_00143ec0;
        uVar11 = (undefined4)local_d0;
        uVar39 = local_d0 & 0xffffffff;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188.name._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_188.name._M_dataplus._M_p);
        }
        puVar15 = (undefined8 *)operator_new(8);
        sVar20 = local_60;
        *puVar15 = 0;
        *(int *)puVar15 = (int)local_68;
        *(undefined4 *)((long)puVar15 + 4) = uVar11;
        pvVar1 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
                 (&((local_108.
                     super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus + local_60 * 3);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar1,*(undefined8 *)(pvVar1 + 8),puVar15,puVar15 + 1);
        pvVar1 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
                 (&((local_108.
                     super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus + sVar20 * 3);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar1,*(undefined8 *)(pvVar1 + 8),
                   local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar39);
        operator_delete(puVar15);
        if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_128.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_1b0 = local_1b0 + 0x10;
      } while (local_70 != local_b0);
    }
    if (0 < local_14c) {
      lVar36 = 1;
      sVar20 = 0;
      do {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_148,
                   local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                   *(undefined8 *)
                    ((long)local_108.
                           super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar36 * 8 + -8),
                   (&((local_108.
                       super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus)[lVar36]._M_p);
        local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start[sVar20] = (longlong)local_a8;
        local_a8 = local_a8 +
                   ((long)(&((local_108.
                              super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus)[lVar36]
                          ._M_p -
                   *(long *)((long)local_108.
                                   super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar36 * 8 + -8));
        sVar20 = sVar20 + 1;
        lVar36 = lVar36 + 3;
      } while (local_b0 != sVar20);
    }
    if (local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1a8,
                 local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish,
                 local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (undefined1 *)
                 (local_80 +
                 (long)local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_start));
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1a8,
                 local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish,
                 local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      puVar22 = local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      sVar12 = (long)local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      if (sVar12 != 0) {
        puVar21 = (uchar *)malloc(sVar12);
        *local_78 = puVar21;
        memcpy(puVar21,puVar22,sVar12);
        if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)&local_108);
        if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_148.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                          .super__Vector_impl_data._M_start);
        }
        if (local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          return sVar12;
        }
        operator_delete(local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        return sVar12;
      }
      goto LAB_00143f07;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00143f07:
  __assert_fail("memory.size() > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                ,0x27a2,
                "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
               );
LAB_00143dfb:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00143e09:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00143e17:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                ,0x2755,
                "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
               );
}

Assistant:

size_t SaveMultiChannelEXRToMemory(const EXRImage *exrImage,
                                   unsigned char **memory_out,
                                   const char **err) {
  if (exrImage == NULL || memory_out == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  std::vector<unsigned char> memory;

  // Header
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};
    memory.insert(memory.end(), header, header + 4);
  }

  // Version, scanline.
  {
    const char marker[] = {2, 0, 0, 0};
    memory.insert(memory.end(), marker, marker + 4);
  }

  int numScanlineBlocks =
      16; // 1 for no compress & ZIPS, 16 for ZIP compression.

  // Write attributes.
  {
    std::vector<unsigned char> data;

    std::vector<ChannelInfo> channels;
    for (int c = 0; c < exrImage->num_channels; c++) {
      ChannelInfo info;
      info.pLinear = 0;
      info.pixelType = exrImage->requested_pixel_types[c];
      info.xSampling = 1;
      info.ySampling = 1;
      info.name = std::string(exrImage->channel_names[c]);
      channels.push_back(info);
    }

    WriteChannelInfo(data, channels);

    WriteAttributeToMemory(memory, "channels", "chlist", &data.at(0),
                           data.size()); // +1 = null
  }

  {
    int compressionType = 3; // ZIP compression
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&compressionType));
    }
    WriteAttributeToMemory(
        memory, "compression", "compression",
        reinterpret_cast<const unsigned char *>(&compressionType), 1);
  }

  {
    int data[4] = {0, 0, exrImage->width - 1, exrImage->height - 1};
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&data[0]));
      swap4(reinterpret_cast<unsigned int *>(&data[1]));
      swap4(reinterpret_cast<unsigned int *>(&data[2]));
      swap4(reinterpret_cast<unsigned int *>(&data[3]));
    }
    WriteAttributeToMemory(memory, "dataWindow", "box2i",
                           reinterpret_cast<const unsigned char *>(data),
                           sizeof(int) * 4);
    WriteAttributeToMemory(memory, "displayWindow", "box2i",
                           reinterpret_cast<const unsigned char *>(data),
                           sizeof(int) * 4);
  }

  {
    unsigned char lineOrder = 0; // increasingY
    WriteAttributeToMemory(memory, "lineOrder", "lineOrder", &lineOrder, 1);
  }

  {
    float aspectRatio = 1.0f;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&aspectRatio));
    }
    WriteAttributeToMemory(
        memory, "pixelAspectRatio", "float",
        reinterpret_cast<const unsigned char *>(&aspectRatio), sizeof(float));
  }

  {
    float center[2] = {0.0f, 0.0f};
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&center[0]));
      swap4(reinterpret_cast<unsigned int *>(&center[1]));
    }
    WriteAttributeToMemory(memory, "screenWindowCenter", "v2f",
                           reinterpret_cast<const unsigned char *>(center),
                           2 * sizeof(float));
  }

  {
    float w = (float)exrImage->width;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&w));
    }
    WriteAttributeToMemory(memory, "screenWindowWidth", "float",
                           reinterpret_cast<const unsigned char *>(&w),
                           sizeof(float));
  }

  // Custom attributes
  if (exrImage->num_custom_attributes > 0) {
    printf("custom\n");
    // @todo { endian }
    for (int i = 0; i < exrImage->num_custom_attributes; i++) {
      WriteAttributeToMemory(memory, exrImage->custom_attributes[i].name, exrImage->custom_attributes[i].type,
                             reinterpret_cast<const unsigned char *>(&exrImage->custom_attributes[i].value),
                             exrImage->custom_attributes[i].size);
        
    }
  }

  { // end of header
    unsigned char e = 0;
    memory.push_back(e);
  }

  int numBlocks = exrImage->height / numScanlineBlocks;
  if (numBlocks * numScanlineBlocks < exrImage->height) {
    numBlocks++;
  }

  std::vector<long long> offsets(numBlocks);

  size_t headerSize = memory.size();
  long long offset =
      headerSize +
      numBlocks * sizeof(long long); // sizeof(header) + sizeof(offsetTable)

  std::vector<unsigned char> data;

  bool isBigEndian = IsBigEndian();

  std::vector<std::vector<unsigned char> > dataList(numBlocks);
  std::vector<size_t> channelOffsetList(exrImage->num_channels);

  int pixelDataSize = 0;
  size_t channelOffset = 0;
  for (int c = 0; c < exrImage->num_channels; c++) {
    channelOffsetList[c] = channelOffset;
    if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
      pixelDataSize += sizeof(unsigned short);
      channelOffset += sizeof(unsigned short);
    } else if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
      pixelDataSize += sizeof(float);
      channelOffset += sizeof(float);
    } else if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_UINT) {
      pixelDataSize += sizeof(unsigned int);
      channelOffset += sizeof(unsigned int);
    } else {
      assert(0);
    }
  }

#ifdef _OPENMP
#pragma omp parallel for
#endif
  for (int i = 0; i < numBlocks; i++) {
    int startY = numScanlineBlocks * i;
    int endY = (std::min)(numScanlineBlocks * (i + 1), exrImage->height);
    int h = endY - startY;

    std::vector<unsigned char> buf(exrImage->width * h * pixelDataSize);

    for (int c = 0; c < exrImage->num_channels; c++) {
      if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {

        if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              FP16 h16;
              h16.u = reinterpret_cast<unsigned short **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              FP32 f32 = half_to_float(h16);

              if (isBigEndian) {
                swap4(reinterpret_cast<unsigned int *>(&f32.f));
              }

              // Assume increasing Y
              float *linePtr = reinterpret_cast<float *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = f32.f;
            }
          }
        } else if (exrImage->requested_pixel_types[c] ==
                   TINYEXR_PIXELTYPE_HALF) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              unsigned short val = reinterpret_cast<unsigned short **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              if (isBigEndian) {
                swap2(&val);
              }

              // Assume increasing Y
              unsigned short *linePtr = reinterpret_cast<unsigned short *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = val;
            }
          }
        } else {
          assert(0);
        }

      } else if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {

        if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              FP32 f32;
              f32.f = reinterpret_cast<float **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              FP16 h16;
              h16 = float_to_half_full(f32);

              if (isBigEndian) {
                swap2(reinterpret_cast<unsigned short *>(&h16.u));
              }

              // Assume increasing Y
              unsigned short *linePtr = reinterpret_cast<unsigned short *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = h16.u;
            }
          }
        } else if (exrImage->requested_pixel_types[c] ==
                   TINYEXR_PIXELTYPE_FLOAT) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              float val = reinterpret_cast<float **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              if (isBigEndian) {
                swap4(reinterpret_cast<unsigned int *>(&val));
              }

              // Assume increasing Y
              float *linePtr = reinterpret_cast<float *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = val;
            }
          }
        } else {
          assert(0);
        }
      } else if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_UINT) {

        for (int y = 0; y < h; y++) {
          for (int x = 0; x < exrImage->width; x++) {
            unsigned int val = reinterpret_cast<unsigned int **>(
                exrImage->images)[c][(y + startY) * exrImage->width + x];

            if (isBigEndian) {
              swap4(&val);
            }

            // Assume increasing Y
            unsigned int *linePtr = reinterpret_cast<unsigned int *>(
                &buf.at(pixelDataSize * y * exrImage->width +
                        channelOffsetList[c] * exrImage->width));
            linePtr[x] = val;
          }
        }
      }
    }

    std::vector<unsigned char> block(miniz::mz_compressBound(buf.size()));
    unsigned long long outSize = block.size();

    CompressZip(&block.at(0), outSize,
                reinterpret_cast<const unsigned char *>(&buf.at(0)),
                buf.size());

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    std::vector<unsigned char> header(8);
    unsigned int dataLen = outSize; // truncate
    memcpy(&header.at(0), &startY, sizeof(int));
    memcpy(&header.at(4), &dataLen, sizeof(unsigned int));

    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&header.at(0)));
      swap4(reinterpret_cast<unsigned int *>(&header.at(4)));
    }

    dataList[i].insert(dataList[i].end(), header.begin(), header.end());
    dataList[i].insert(dataList[i].end(), block.begin(),
                       block.begin() + dataLen);

    // data.insert(data.end(), header.begin(), header.end());
    // data.insert(data.end(), block.begin(), block.begin() + dataLen);

    // offsets[i] = offset;
    // if (IsBigEndian()) {
    //  swap8(reinterpret_cast<unsigned long long*>(&offsets[i]));
    //}
    // offset += dataLen + 8; // 8 = sizeof(blockHeader)
  } // omp parallel

  for (int i = 0; i < numBlocks; i++) {

    data.insert(data.end(), dataList[i].begin(), dataList[i].end());

    offsets[i] = offset;
    if (IsBigEndian()) {
      swap8(reinterpret_cast<unsigned long long *>(&offsets[i]));
    }
    offset += dataList[i].size();
  }

  {
    memory.insert(memory.end(),
                  reinterpret_cast<unsigned char *>(&offsets.at(0)),
                  reinterpret_cast<unsigned char *>(&offsets.at(0)) +
                      sizeof(unsigned long long) * numBlocks);
  }

  { memory.insert(memory.end(), data.begin(), data.end()); }

  assert(memory.size() > 0);

  (*memory_out) = (unsigned char *)malloc(memory.size());
  memcpy((*memory_out), &memory.at(0), memory.size());

  return memory.size(); // OK
}